

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser.cpp
# Opt level: O2

int ParseExpUnair(char **p,aint *nval)

{
  char *pcVar1;
  undefined1 uVar2;
  bool bVar3;
  int iVar4;
  uint uVar5;
  aint right;
  
  SkipBlanks(p);
  pcVar1 = *p;
  iVar4 = cmphstr(p,"norel",true);
  uVar2 = Relocation::areLabelsOffset;
  if (iVar4 != 0) {
    Relocation::areLabelsOffset = 0;
    iVar4 = ParseExpPrim(p,nval);
    if (iVar4 != 0) {
      Relocation::areLabelsOffset = uVar2;
      return 1;
    }
    Relocation::areLabelsOffset = uVar2;
    *p = pcVar1;
  }
  iVar4 = cmphstr(p,"exist",true);
  if (iVar4 != 0) {
    iVar4 = need(p,'(');
    if ((iVar4 != 0) || (bVar3 = isLabelStart(*p,true), bVar3)) {
      bVar3 = LabelExist(p,nval);
      if (bVar3 && iVar4 != 0) {
        uVar5 = need(p,')');
      }
      else {
        uVar5 = (uint)bVar3;
      }
      if (uVar5 != 0) {
        return 1;
      }
    }
    *p = pcVar1;
  }
  iVar4 = need(p,"! ~ + - ");
  if (((iVar4 == 0) && (iVar4 = needa(p,"not",0x21,"low",0x6c,"high",0x68,true), iVar4 == 0)) &&
     (iVar4 = needa(p,"abs",0x61,(char *)0x0,0,(char *)0x0,0,true), iVar4 == 0)) {
    iVar4 = ParseExpPrim(p,nval);
    return iVar4;
  }
  if (iVar4 == 0x7e) {
    iVar4 = ParseExpUnair(p,&right);
    if (iVar4 == 0) {
      return 0;
    }
    right = ~right;
  }
  else if (iVar4 == 0x2b) {
    iVar4 = ParseExpUnair(p,&right);
    if (iVar4 == 0) {
      return 0;
    }
  }
  else if (iVar4 == 0x2d) {
    iVar4 = ParseExpUnair(p,&right);
    if (iVar4 == 0) {
      return 0;
    }
    right = -right;
  }
  else {
    if (iVar4 == 0x61) {
      iVar4 = ParseExpUnair(p,&right);
      if (iVar4 != 0) {
        iVar4 = -right;
        if (0 < right) {
          iVar4 = right;
        }
        *nval = iVar4;
        return 1;
      }
      return 0;
    }
    if (iVar4 == 0x68) {
      iVar4 = ParseExpUnair(p,&right);
      if (iVar4 == 0) {
        return 0;
      }
      right = (uint)right >> 8 & 0xff;
    }
    else if (iVar4 == 0x6c) {
      iVar4 = ParseExpUnair(p,&right);
      if (iVar4 == 0) {
        return 0;
      }
      right = right & 0xff;
    }
    else {
      if (iVar4 != 0x21) {
        Error("internal error",(char *)0x0,FATAL);
        return 1;
      }
      iVar4 = ParseExpUnair(p,&right);
      if (iVar4 == 0) {
        return 0;
      }
      right = -(uint)(right == 0);
    }
  }
  *nval = right;
  return 1;
}

Assistant:

static int ParseExpUnair(char*& p, aint& nval) {
	SkipBlanks(p);
	char* oldP = p;
	if (cmphstr(p, "norel", true)) {
		// switch off alternative relocation evaluation for the following part of expression
		const bool oldAreLabelsOffset = Relocation::areLabelsOffset;
		Relocation::areLabelsOffset = false;
		int norelParseRes = ParseExpPrim(p, nval);			// higher priority than other unary
		Relocation::areLabelsOffset = oldAreLabelsOffset;	// restore alternative evaluation
		if (norelParseRes) return 1;
		// "norel" operator didn't parse successfully, try to ignore it (will treat it as label)
		p = oldP;
	}
	if (cmphstr(p, "exist", true)) {
		int existEval = 0, hasParentheses = need(p, '(');
		if (hasParentheses || isLabelStart(p)) {
			existEval = LabelExist(p, nval);
		}
		if (existEval && hasParentheses) {
			existEval = need(p, ')');						// check closing parenthesis
		}
		if (existEval) return 1;
		p = oldP;
	}
	aint right;
	int oper;
	if ((oper = need(p, "! ~ + - ")) || \
		(oper = needa(p, "not", '!', "low", 'l', "high", 'h', true)) || \
		(oper = needa(p, "abs", 'a', nullptr, 0, nullptr, 0, true)) ) {
		switch (oper) {
		case '!':
			if (!ParseExpUnair(p, right)) return 0;
			nval = -!right;
			break;
		case '~':
			if (!ParseExpUnair(p, right)) return 0;
			nval = ~right;
			break;
		case '+':
			if (!ParseExpUnair(p, right)) return 0;
			nval = right;
			break;
		case '-':
			if (!ParseExpUnair(p, right)) return 0;
			nval = ~right + 1;
			break;
		case 'l':
			if (!ParseExpUnair(p, right)) return 0;
			nval = right & 255;
			break;
		case 'h':
			if (!ParseExpUnair(p, right)) return 0;
			nval = (right >> 8) & 255;
			break;
		case 'a':
			if (!ParseExpUnair(p, right)) return 0;
			nval = abs(right);
			break;
		default: Error("internal error", nullptr, FATAL); break;	// unreachable
		}
		return 1;
	} else {
		return ParseExpPrim(p, nval);
	}
}